

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree.cpp
# Opt level: O0

void print_block(Block *b,ProxyWithLink *cp,bool verbose)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  reference args_3;
  reference args_2;
  char (*format_str) [22];
  reference args;
  reference i_00;
  RegularLink<diy::Bounds<float>_> *this;
  reference args_3_00;
  size_type sVar3;
  reference pvVar4;
  char *in_RDX;
  ProxyWithLink *in_RSI;
  long in_RDI;
  size_t i_1;
  Bounds *bounds;
  int i;
  RCLink *link;
  size_type in_stack_fffffffffffffe18;
  small_vector<float,_4UL,_0UL,_std::allocator<float>_> *in_stack_fffffffffffffe20;
  RegularLink<diy::Bounds<float>_> *this_00;
  const_reference in_stack_fffffffffffffe70;
  const_reference in_stack_fffffffffffffe78;
  float *in_stack_fffffffffffffe80;
  char (*in_stack_fffffffffffffe88) [12];
  int *args_4;
  undefined4 in_stack_fffffffffffffeb0;
  RegularLink<diy::Bounds<float>_> *format_str_00;
  ulong local_120;
  float *in_stack_ffffffffffffff00;
  float *in_stack_ffffffffffffff08;
  float *in_stack_ffffffffffffff10;
  float *in_stack_ffffffffffffff18;
  int *in_stack_ffffffffffffff20;
  char (*in_stack_ffffffffffffff28) [55];
  float *in_stack_ffffffffffffff70;
  float *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  unsigned_long *in_stack_ffffffffffffff88;
  int local_3c;
  int local_30;
  int local_2c;
  RegularLink<diy::Bounds<float>_> *local_28;
  byte local_19;
  ProxyWithLink *local_18;
  long local_10;
  
  local_19 = (byte)in_RDX & 1;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = diy::Master::ProxyWithLink::link(in_RSI,(char *)in_RSI,in_RDX);
  local_28 = (RegularLink<diy::Bounds<float>_> *)CONCAT44(extraout_var,iVar1);
  local_2c = diy::Master::Proxy::gid(&local_18->super_Proxy);
  diy::RegularLink<diy::Bounds<float>_>::bounds(local_28);
  args_3 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                     (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  diy::RegularLink<diy::Bounds<float>_>::bounds(local_28);
  args_2 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                     (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  diy::RegularLink<diy::Bounds<float>_>::bounds(local_28);
  format_str = (char (*) [22])
               itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                         (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  diy::RegularLink<diy::Bounds<float>_>::bounds(local_28);
  args = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                   (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  diy::RegularLink<diy::Bounds<float>_>::bounds(local_28);
  i_00 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                   (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  diy::RegularLink<diy::Bounds<float>_>::bounds(local_28);
  this = (RegularLink<diy::Bounds<float>_> *)
         itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                   (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_30 = diy::Link::size((Link *)0x11005a);
  std::vector<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>::size
            ((vector<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_> *)(local_10 + 0x80));
  this_00 = (RegularLink<diy::Bounds<float>_> *)&stack0xffffffffffffffd0;
  format_str_00 = this;
  fmt::v7::print<char[55],int,float&,float&,float&,float&,float&,float&,int,unsigned_long,char>
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff88);
  local_3c = 0;
  while (iVar1 = local_3c, iVar2 = diy::Link::size((Link *)0x110102), iVar1 < iVar2) {
    diy::Link::target((Link *)this,(int)((ulong)i_00 >> 0x20));
    diy::Link::target((Link *)this,(int)((ulong)i_00 >> 0x20));
    args_4 = (int *)&stack0xffffffffffffff80;
    diy::RegularLink<diy::Bounds<float>_>::direction(this_00,(int)((ulong)this >> 0x20));
    args_3_00 = itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                          ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)this,(size_type)i_00
                          );
    diy::RegularLink<diy::Bounds<float>_>::direction(this_00,(int)((ulong)this >> 0x20));
    in_stack_fffffffffffffe88 =
         (char (*) [12])
         itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                   ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)this,(size_type)i_00);
    diy::RegularLink<diy::Bounds<float>_>::direction(this_00,(int)((ulong)this >> 0x20));
    in_stack_fffffffffffffe80 =
         (float *)itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::operator[]
                            ((small_vector<int,_4UL,_0UL,_std::allocator<int>_> *)this,
                             (size_type)i_00);
    fmt::v7::print<char[22],int&,int&,int&,int&,int&,char>
              (format_str,(int *)args_2,(int *)args_3,
               (int *)CONCAT44(iVar1,in_stack_fffffffffffffeb0),args_3_00,args_4);
    diy::Direction::~Direction((Direction *)0x110233);
    diy::Direction::~Direction((Direction *)0x110240);
    diy::Direction::~Direction((Direction *)0x11024d);
    diy::RegularLink<diy::Bounds<float>_>::bounds(this,(int)((ulong)i_00 >> 0x20));
    itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
              ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)this,(size_type)i_00);
    itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
              ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)this,(size_type)i_00);
    itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
              ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)this,(size_type)i_00);
    in_stack_fffffffffffffe70 =
         itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                   ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)this,(size_type)i_00);
    in_stack_fffffffffffffe78 =
         itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                   ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)this,(size_type)i_00);
    i_00 = itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator[]
                     ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)this,(size_type)i_00)
    ;
    fmt::v7::
    print<char[26],float_const&,float_const&,float_const&,float_const&,float_const&,float_const&,char>
              ((char (*) [26])format_str_00,args,(float *)format_str,args_2,args_3,
               (float *)CONCAT44(iVar1,in_stack_fffffffffffffeb0),in_stack_ffffffffffffff10);
    local_3c = local_3c + 1;
  }
  if ((local_19 & 1) != 0) {
    for (local_120 = 0;
        sVar3 = std::vector<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>::size
                          ((vector<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_> *)
                           (local_10 + 0x80)), local_120 < sVar3; local_120 = local_120 + 1) {
      pvVar4 = std::vector<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>::operator[]
                         ((vector<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_> *)
                          (local_10 + 0x80),local_120);
      SimplePoint<2U>::operator[](pvVar4,0);
      pvVar4 = std::vector<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>::operator[]
                         ((vector<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_> *)
                          (local_10 + 0x80),local_120);
      SimplePoint<2U>::operator[](pvVar4,1);
      pvVar4 = std::vector<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_>::operator[]
                         ((vector<SimplePoint<2U>,_std::allocator<SimplePoint<2U>_>_> *)
                          (local_10 + 0x80),local_120);
      SimplePoint<2U>::operator[](pvVar4,2);
      fmt::v7::print<char[12],float&,float&,float&,char>
                (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                 in_stack_fffffffffffffe70);
    }
  }
  return;
}

Assistant:

void print_block(Block* b, const diy::Master::ProxyWithLink& cp, bool verbose)
{
  RCLink*  link      = static_cast<RCLink*>(cp.link());

  fmt::print("{}: [{},{},{}] - [{},{},{}] ({} neighbors): {} points\n",
                  cp.gid(),
                  link->bounds().min[0], link->bounds().min[1], link->bounds().min[2],
                  link->bounds().max[0], link->bounds().max[1], link->bounds().max[2],
                  link->size(), b->points.size());

  for (int i = 0; i < link->size(); ++i)
  {
      fmt::print("  ({},{},({},{},{})):",
                      link->target(i).gid, link->target(i).proc,
                      link->direction(i)[0],
                      link->direction(i)[1],
                      link->direction(i)[2]);
      const Bounds& bounds = link->bounds(i);
      fmt::print(" [{},{},{}] - [{},{},{}]\n",
              bounds.min[0], bounds.min[1], bounds.min[2],
              bounds.max[0], bounds.max[1], bounds.max[2]);
  }

  if (verbose)
    for (size_t i = 0; i < b->points.size(); ++i)
      fmt::print("  {} {} {}\n", b->points[i][0], b->points[i][1], b->points[i][2]);
}